

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O3

int __thiscall Rainbow::flFTP::JoinServer(flFTP *this,string *host,string *service)

{
  CommPort *pCVar1;
  pointer pcVar2;
  __uniq_ptr_data<Rainbow::TcpSockClient,_std::default_delete<Rainbow::TcpSockClient>,_true,_true>
  _Var3;
  int iVar4;
  char message [512];
  string local_298;
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  undefined1 local_238 [520];
  
  std::__cxx11::string::_M_assign((string *)&this->_host);
  pCVar1 = (this->_commPort)._M_t.
           super___uniq_ptr_impl<Rainbow::CommPort,_std::default_delete<Rainbow::CommPort>_>._M_t.
           super__Tuple_impl<0UL,_Rainbow::CommPort_*,_std::default_delete<Rainbow::CommPort>_>.
           super__Head_base<0UL,_Rainbow::CommPort_*,_false>._M_head_impl;
  pcVar2 = (host->_M_dataplus)._M_p;
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258,pcVar2,pcVar2 + host->_M_string_length);
  pcVar2 = (service->_M_dataplus)._M_p;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,pcVar2,pcVar2 + service->_M_string_length);
  _Var3.super___uniq_ptr_impl<Rainbow::TcpSockClient,_std::default_delete<Rainbow::TcpSockClient>_>.
  _M_t.
  super__Tuple_impl<0UL,_Rainbow::TcpSockClient_*,_std::default_delete<Rainbow::TcpSockClient>_>.
  super__Head_base<0UL,_Rainbow::TcpSockClient_*,_false>._M_head_impl =
       (pCVar1->_tcpSock)._M_t.
       super___uniq_ptr_impl<Rainbow::TcpSockClient,_std::default_delete<Rainbow::TcpSockClient>_>;
  iVar4 = (*(code *)**(undefined8 **)
                      _Var3.
                      super___uniq_ptr_impl<Rainbow::TcpSockClient,_std::default_delete<Rainbow::TcpSockClient>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Rainbow::TcpSockClient_*,_std::default_delete<Rainbow::TcpSockClient>_>
                      .super__Head_base<0UL,_Rainbow::TcpSockClient_*,_false>._M_head_impl)
                    (_Var3.
                     super___uniq_ptr_impl<Rainbow::TcpSockClient,_std::default_delete<Rainbow::TcpSockClient>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rainbow::TcpSockClient_*,_std::default_delete<Rainbow::TcpSockClient>_>
                     .super__Head_base<0UL,_Rainbow::TcpSockClient_*,_false>._M_head_impl,local_258,
                     local_278);
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  if (iVar4 < 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->_errorMessage,0,(char *)(this->_errorMessage)._M_string_length,0x11c684
              );
    iVar4 = -1;
  }
  else {
    memset(local_238,0,0x200);
    pCVar1 = (this->_commPort)._M_t.
             super___uniq_ptr_impl<Rainbow::CommPort,_std::default_delete<Rainbow::CommPort>_>._M_t.
             super__Tuple_impl<0UL,_Rainbow::CommPort_*,_std::default_delete<Rainbow::CommPort>_>.
             super__Head_base<0UL,_Rainbow::CommPort_*,_false>._M_head_impl;
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"220","");
    iVar4 = CommPort::Recv(pCVar1,local_238,0x1ff,0,&local_298,&this->_errorMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    iVar4 = iVar4 >> 0x1f;
  }
  return iVar4;
}

Assistant:

int flFTP::JoinServer(const std::string &host, const std::string &service)
	{
		_host = host;
		if(_commPort->Connect(host, service) < 0)
		{
			_errorMessage = "connection failed";
			return -1;
		}
		int ret;
		char message[BUFFER] = { 0 };

		ret = _commPort->Recv(message, BUFFER - 1, 0, FTP_SERVER_READY_OK, _errorMessage);
		if(ret < 0)
		{
			return -1;
		}

		return 0;
	}